

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURL_conflict * curl_easy_duphandle(Curl_easy *data)

{
  curl_mimepart *part;
  undefined1 *puVar1;
  CURLcode CVar2;
  Curl_easy *easy;
  size_t length;
  char *pcVar3;
  CookieInfo *pCVar4;
  curl_slist *pcVar5;
  long lVar6;
  
  easy = (Curl_easy *)(*Curl_ccalloc)(1,0x1458);
  if (easy == (Curl_easy *)0x0) {
    return (CURL_conflict *)0x0;
  }
  (easy->set).buffer_size = (data->set).buffer_size;
  memcpy(&easy->set,&data->set,0x8f0);
  part = &(easy->set).mimepost;
  Curl_mime_initpart(part,easy);
  memset((easy->set).str,0,0x278);
  lVar6 = 0x730;
  do {
    CVar2 = Curl_setstropt((char **)((long)&easy->magic + lVar6),
                           *(char **)((long)&data->magic + lVar6));
    if (CVar2 != CURLE_OK) goto LAB_00109ac3;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x990);
  (easy->set).blobs[6] = (curl_blob *)0x0;
  (easy->set).blobs[7] = (curl_blob *)0x0;
  (easy->set).blobs[4] = (curl_blob *)0x0;
  (easy->set).blobs[5] = (curl_blob *)0x0;
  (easy->set).blobs[2] = (curl_blob *)0x0;
  (easy->set).blobs[3] = (curl_blob *)0x0;
  (easy->set).blobs[0] = (curl_blob *)0x0;
  (easy->set).blobs[1] = (curl_blob *)0x0;
  lVar6 = 0x9a8;
  do {
    CVar2 = Curl_setblobopt((curl_blob **)((long)&easy->magic + lVar6),
                            *(curl_blob **)((long)&data->magic + lVar6));
    if (CVar2 != CURLE_OK) goto LAB_00109ac3;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x9e8);
  lVar6 = (data->set).postfieldsize;
  if ((lVar6 != 0) && (pcVar3 = (data->set).str[0x4d], pcVar3 != (char *)0x0)) {
    length = curlx_sotouz(lVar6);
    pcVar3 = (char *)Curl_memdup(pcVar3,length);
    (easy->set).str[0x4d] = pcVar3;
    if (pcVar3 == (char *)0x0) goto LAB_00109ac3;
    (easy->set).postfields = pcVar3;
  }
  CVar2 = Curl_mime_duppart(part,&(data->set).mimepost);
  if ((data->set).resolve != (curl_slist *)0x0) {
    (easy->state).resolve = (easy->set).resolve;
  }
  if (CVar2 == CURLE_OK) {
    Curl_dyn_init(&(easy->state).headerb,0x19000);
    (easy->state).conn_cache = (conncache *)0x0;
    (easy->state).lastconnect_id = -1;
    (easy->progress).flags = (data->progress).flags;
    (easy->progress).field_0x184 =
         (easy->progress).field_0x184 & 0xfe | (data->progress).field_0x184 & 1;
    if (data->cookies != (CookieInfo *)0x0) {
      pCVar4 = Curl_cookie_init(data,data->cookies->filename,easy->cookies,
                                SUB41((*(uint *)&(data->set).field_0x8e2 & 4) >> 2,0));
      easy->cookies = pCVar4;
      if (pCVar4 == (CookieInfo *)0x0) goto LAB_00109ac3;
    }
    pcVar5 = (data->state).cookielist;
    if (pcVar5 != (curl_slist *)0x0) {
      pcVar5 = Curl_slist_duplicate(pcVar5);
      (easy->state).cookielist = pcVar5;
      if (pcVar5 == (curl_slist *)0x0) goto LAB_00109ac3;
    }
    pcVar3 = (data->state).url;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(pcVar3);
      (easy->state).url = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00109ac3;
      puVar1 = &(easy->state).field_0x6d2;
      *puVar1 = *puVar1 | 2;
    }
    pcVar3 = (data->state).referer;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(pcVar3);
      (easy->state).referer = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_00109ac3;
      puVar1 = &(easy->state).field_0x6d2;
      *puVar1 = *puVar1 | 4;
    }
    pcVar3 = (easy->set).str[0x29];
    if ((pcVar3 == (char *)0x0) || (CVar2 = Curl_ssl_set_engine(easy,pcVar3), CVar2 == CURLE_OK)) {
      Curl_initinfo(easy);
      easy->magic = 0xc0dedbad;
      return easy;
    }
  }
LAB_00109ac3:
  curl_slist_free_all((easy->state).cookielist);
  (easy->state).cookielist = (curl_slist *)0x0;
  (*Curl_cfree)((easy->state).buffer);
  (easy->state).buffer = (char *)0x0;
  Curl_dyn_free(&(easy->state).headerb);
  (*Curl_cfree)((easy->state).url);
  (easy->state).url = (char *)0x0;
  (*Curl_cfree)((easy->state).referer);
  (easy->state).referer = (char *)0x0;
  Curl_freeset(easy);
  (*Curl_cfree)(easy);
  return (CURL_conflict *)0x0;
}

Assistant:

struct Curl_easy *curl_easy_duphandle(struct Curl_easy *data)
{
  struct Curl_easy *outcurl = calloc(1, sizeof(struct Curl_easy));
  if(!outcurl)
    goto fail;

  /*
   * We setup a few buffers we need. We should probably make them
   * get setup on-demand in the code, as that would probably decrease
   * the likeliness of us forgetting to init a buffer here in the future.
   */
  outcurl->set.buffer_size = data->set.buffer_size;

  /* copy all userdefined values */
  if(dupset(outcurl, data))
    goto fail;

  Curl_dyn_init(&outcurl->state.headerb, CURL_MAX_HTTP_HEADER);

  /* the connection cache is setup on demand */
  outcurl->state.conn_cache = NULL;
  outcurl->state.lastconnect_id = -1;

  outcurl->progress.flags    = data->progress.flags;
  outcurl->progress.callback = data->progress.callback;

#ifndef CURL_DISABLE_COOKIES
  if(data->cookies) {
    /* If cookies are enabled in the parent handle, we enable them
       in the clone as well! */
    outcurl->cookies = Curl_cookie_init(data,
                                        data->cookies->filename,
                                        outcurl->cookies,
                                        data->set.cookiesession);
    if(!outcurl->cookies)
      goto fail;
  }

  /* duplicate all values in 'change' */
  if(data->state.cookielist) {
    outcurl->state.cookielist =
      Curl_slist_duplicate(data->state.cookielist);
    if(!outcurl->state.cookielist)
      goto fail;
  }
#endif

  if(data->state.url) {
    outcurl->state.url = strdup(data->state.url);
    if(!outcurl->state.url)
      goto fail;
    outcurl->state.url_alloc = TRUE;
  }

  if(data->state.referer) {
    outcurl->state.referer = strdup(data->state.referer);
    if(!outcurl->state.referer)
      goto fail;
    outcurl->state.referer_alloc = TRUE;
  }

  /* Reinitialize an SSL engine for the new handle
   * note: the engine name has already been copied by dupset */
  if(outcurl->set.str[STRING_SSL_ENGINE]) {
    if(Curl_ssl_set_engine(outcurl, outcurl->set.str[STRING_SSL_ENGINE]))
      goto fail;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(data->asi) {
    outcurl->asi = Curl_altsvc_init();
    if(!outcurl->asi)
      goto fail;
    if(outcurl->set.str[STRING_ALTSVC])
      (void)Curl_altsvc_load(outcurl->asi, outcurl->set.str[STRING_ALTSVC]);
  }
#endif
#ifndef CURL_DISABLE_HSTS
  if(data->hsts) {
    outcurl->hsts = Curl_hsts_init();
    if(!outcurl->hsts)
      goto fail;
    if(outcurl->set.str[STRING_HSTS])
      (void)Curl_hsts_loadfile(outcurl,
                               outcurl->hsts, outcurl->set.str[STRING_HSTS]);
    (void)Curl_hsts_loadcb(outcurl, outcurl->hsts);
  }
#endif
  /* Clone the resolver handle, if present, for the new handle */
  if(Curl_resolver_duphandle(outcurl,
                             &outcurl->state.async.resolver,
                             data->state.async.resolver))
    goto fail;

#ifdef USE_ARES
  {
    CURLcode rc;

    rc = Curl_set_dns_servers(outcurl, data->set.str[STRING_DNS_SERVERS]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;

    rc = Curl_set_dns_interface(outcurl, data->set.str[STRING_DNS_INTERFACE]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;

    rc = Curl_set_dns_local_ip4(outcurl, data->set.str[STRING_DNS_LOCAL_IP4]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;

    rc = Curl_set_dns_local_ip6(outcurl, data->set.str[STRING_DNS_LOCAL_IP6]);
    if(rc && rc != CURLE_NOT_BUILT_IN)
      goto fail;
  }
#endif /* USE_ARES */

  Curl_initinfo(outcurl);

  outcurl->magic = CURLEASY_MAGIC_NUMBER;

  /* we reach this point and thus we are OK */

  return outcurl;

  fail:

  if(outcurl) {
#ifndef CURL_DISABLE_COOKIES
    curl_slist_free_all(outcurl->state.cookielist);
    outcurl->state.cookielist = NULL;
#endif
    Curl_safefree(outcurl->state.buffer);
    Curl_dyn_free(&outcurl->state.headerb);
    Curl_safefree(outcurl->state.url);
    Curl_safefree(outcurl->state.referer);
    Curl_altsvc_cleanup(&outcurl->asi);
    Curl_hsts_cleanup(&outcurl->hsts);
    Curl_freeset(outcurl);
    free(outcurl);
  }

  return NULL;
}